

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O3

void Sdm_ManFree(Sdm_Man_t *p)

{
  Vec_Wrd_t *pVVar1;
  word *pwVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Hsh_IntMan_t *__ptr;
  
  pVVar1 = p->vPerm6;
  pwVar2 = pVVar1->pArray;
  if (pwVar2 != (word *)0x0) {
    free(pwVar2);
  }
  free(pVVar1);
  pVVar3 = p->vMap2Perm;
  piVar4 = pVVar3->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar3);
  pVVar3 = p->vConfgRes;
  piVar4 = pVVar3->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar3);
  pVVar3 = p->pHash->vData;
  piVar4 = pVVar3->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar3);
  __ptr = p->pHash;
  pVVar3 = __ptr->vTable;
  piVar4 = pVVar3->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar3);
  pVVar1 = __ptr->vObjs;
  pwVar2 = pVVar1->pArray;
  if (pwVar2 != (word *)0x0) {
    free(pwVar2);
  }
  free(pVVar1);
  free(__ptr);
  free(p);
  return;
}

Assistant:

void Sdm_ManFree( Sdm_Man_t * p )
{
    Vec_WrdFree( p->vPerm6 );
    Vec_IntFree( p->vMap2Perm );
    Vec_IntFree( p->vConfgRes );
    Vec_IntFree( p->pHash->vData );
    Hsh_IntManStop( p->pHash );
    ABC_FREE( p );
}